

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamhdr.c
# Opt level: O3

void nn_streamhdr_start(nn_streamhdr *self,nn_usock *usock,nn_pipebase *pipebase)

{
  int protocol;
  size_t sz;
  uint16_t local_24 [2];
  size_t local_20;
  
  if ((self->usock == (nn_usock *)0x0) && ((self->usock_owner).fsm == (nn_fsm *)0x0)) {
    (self->usock_owner).src = 1;
    (self->usock_owner).fsm = &self->fsm;
    nn_usock_swap_owner(usock,&self->usock_owner);
    self->usock = usock;
    self->pipebase = pipebase;
    local_20 = 4;
    nn_pipebase_getopt(pipebase,0,0xd,local_24,&local_20);
    if (local_20 == 4) {
      self->protohdr[0] = '\0';
      self->protohdr[1] = 'S';
      self->protohdr[2] = 'P';
      self->protohdr[3] = '\0';
      self->protohdr[4] = '\0';
      self->protohdr[5] = '\0';
      self->protohdr[6] = '\0';
      self->protohdr[7] = '\0';
      nn_puts(self->protohdr + 4,local_24[0]);
      nn_fsm_start(&self->fsm);
      return;
    }
  }
  else {
    nn_streamhdr_start_cold_1();
  }
  nn_streamhdr_start_cold_2();
}

Assistant:

void nn_streamhdr_start (struct nn_streamhdr *self, struct nn_usock *usock,
    struct nn_pipebase *pipebase)
{
    size_t sz;
    int protocol;

    /*  Take ownership of the underlying socket. */
    nn_assert (self->usock == NULL && self->usock_owner.fsm == NULL);
    self->usock_owner.src = NN_STREAMHDR_SRC_USOCK;
    self->usock_owner.fsm = &self->fsm;
    nn_usock_swap_owner (usock, &self->usock_owner);
    self->usock = usock;
    self->pipebase = pipebase;

    /*  Get the protocol identifier. */
    sz = sizeof (protocol);
    nn_pipebase_getopt (pipebase, NN_SOL_SOCKET, NN_PROTOCOL, &protocol, &sz);
    nn_assert (sz == sizeof (protocol));

    /*  Compose the protocol header. */
    memcpy (self->protohdr, "\0SP\0\0\0\0\0", 8);
    nn_puts (self->protohdr + 4, (uint16_t) protocol);

    /*  Launch the state machine. */
    nn_fsm_start (&self->fsm);
}